

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

void __thiscall Directory::Directory(Directory *this,string *inPath)

{
  MutexFactory *this_00;
  Mutex *pMVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  Directory *in_stack_000000e8;
  bool local_59;
  
  *in_RDI = &PTR__Directory_00223898;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ce968);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ce97b);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  this_00 = MutexFactory::i();
  pMVar1 = MutexFactory::getMutex(this_00);
  in_RDI[0xc] = pMVar1;
  local_59 = false;
  if (in_RDI[0xc] != 0) {
    local_59 = refresh(in_stack_000000e8);
  }
  *(bool *)(in_RDI + 5) = local_59;
  return;
}

Assistant:

Directory::Directory(std::string inPath)
{
	path = inPath;
	dirMutex = MutexFactory::i()->getMutex();

	valid = (dirMutex != NULL) && refresh();
}